

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void bitmapFromData(uint16_t *data,uint64_t nData,uint8_t *bitmap,uint16_t *minNonZero,
                   uint16_t *maxNonZero)

{
  uint16_t i_2;
  uint64_t i_1;
  int i;
  uint16_t mxnz;
  uint16_t mnnz;
  uint16_t *maxNonZero_local;
  uint16_t *minNonZero_local;
  uint8_t *bitmap_local;
  uint64_t nData_local;
  uint16_t *data_local;
  
  mnnz = 0x1fff;
  mxnz = 0;
  for (i = 0; i < 0x2000; i = i + 1) {
    bitmap[i] = '\0';
  }
  for (i_1 = 0; i_1 < nData; i_1 = i_1 + 1) {
    bitmap[(int)(uint)data[i_1] >> 3] =
         bitmap[(int)(uint)data[i_1] >> 3] | (byte)(1 << ((byte)data[i_1] & 7));
  }
  *bitmap = *bitmap & 0xfe;
  for (i_2 = 0; i_2 < 0x2000; i_2 = i_2 + 1) {
    if (bitmap[i_2] != '\0') {
      if (i_2 < mnnz) {
        mnnz = i_2;
      }
      if (mxnz < i_2) {
        mxnz = i_2;
      }
    }
  }
  *minNonZero = mnnz;
  *maxNonZero = mxnz;
  return;
}

Assistant:

static void
bitmapFromData (
    const uint16_t* data,
    uint64_t        nData,
    uint8_t*        bitmap,
    uint16_t*       minNonZero,
    uint16_t*       maxNonZero)
{
    uint16_t mnnz = BITMAP_SIZE - 1;
    uint16_t mxnz = 0;

    for (int i = 0; i < BITMAP_SIZE; ++i)
        bitmap[i] = 0;

    for (uint64_t i = 0; i < nData; ++i)
        bitmap[data[i] >> 3] |= (1 << (data[i] & 7));

    bitmap[0] &= ~1; // zero is not explicitly stored in
                     // the bitmap; we assume that the
                     // data always contain zeroes

    for (uint16_t i = 0; i < BITMAP_SIZE; ++i)
    {
        if (bitmap[i])
        {
            if (mnnz > i) mnnz = i;
            if (mxnz < i) mxnz = i;
        }
    }
    *minNonZero = mnnz;
    *maxNonZero = mxnz;
}